

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall FDecalLib::AddDecal(FDecalLib *this,FDecalBase *decal)

{
  WORD num;
  NameEntry *pNVar1;
  uint uVar2;
  FDecalBase *pFVar3;
  uint i;
  ulong uVar4;
  FDecalLib *pFVar5;
  FDecalBase *from;
  
  pFVar3 = this->Root;
  num = decal->SpawnID;
  decal->SpawnID = 0;
  pNVar1 = FName::NameData.NameArray;
  pFVar5 = this;
  from = pFVar3;
  do {
    if (from == (FDecalBase *)0x0) {
      pFVar5->Root = decal;
      decal->Left = (FDecalBase *)0x0;
      decal->Right = (FDecalBase *)0x0;
LAB_0038f9d1:
      if (num != 0) {
        pFVar3 = ScanTreeForNum(num,this->Root);
        if (pFVar3 != (FDecalBase *)0x0) {
          pFVar3->SpawnID = 0;
        }
        decal->SpawnID = num;
      }
      return;
    }
    uVar2 = strcasecmp(pNVar1[(decal->Name).Index].Text,pNVar1[(from->Name).Index].Text);
    if (uVar2 == 0) {
      ReplaceDecalRef(from,decal,pFVar3);
      pFVar3 = from->Right;
      decal->Left = from->Left;
      decal->Right = pFVar3;
      pFVar5->Root = decal;
      uVar2 = (from->Users).Count;
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        *(FDecalBase **)((from->Users).Array[uVar4]->Defaults + 0x478) = decal;
      }
      TArray<const_PClass_*,_const_PClass_*>::operator=(&decal->Users,&from->Users);
      (*from->_vptr_FDecalBase[3])(from);
      goto LAB_0038f9d1;
    }
    pFVar5 = (FDecalLib *)(&from->Left + (~uVar2 >> 0x1f));
    from = pFVar5->Root;
  } while( true );
}

Assistant:

void FDecalLib::AddDecal (FDecalBase *decal)
{
	FDecalBase *node = Root, **prev = &Root;
	int num = decal->SpawnID;

	decal->SpawnID = 0;

	// Check if this decal already exists.
	while (node != NULL)
	{
		int lexx = stricmp (decal->Name, node->Name);
		if (lexx == 0)
		{
			break;
		}
		else if (lexx < 0)
		{
			prev = &node->Left;
			node = node->Left;
		}
		else
		{
			prev = &node->Right;
			node = node->Right;
		}
	}
	if (node == NULL)
	{ // No, add it.
		decal->SpawnID = 0;
		*prev = decal;
		decal->Left = NULL;
		decal->Right = NULL;
	}
	else
	{ // Yes, replace the old one.
		// If this decal has been used as the lowerdecal for another decal,
		// be sure and update the lowerdecal to use the new decal.
		ReplaceDecalRef(node, decal, Root);

		decal->Left = node->Left;
		decal->Right = node->Right;
		*prev = decal;

		// Fix references to the old decal so that they use the new one instead.
		for (unsigned int i = 0; i < node->Users.Size(); ++i)
		{
			((AActor *)node->Users[i]->Defaults)->DecalGenerator = decal;
		}
		decal->Users = node->Users;
		delete node;
	}
	// If this decal has an ID, make sure no existing decals have the same ID.
	if (num != 0)
	{
		FDecalBase *spawner = ScanTreeForNum (num, Root);
		if (spawner != NULL)
		{
			spawner->SpawnID = 0;
		}
		decal->SpawnID = num;
	}
}